

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ConvertComplexPass.h
# Opt level: O0

StructDeclaration * __thiscall
soul::ConvertComplexPass::ConvertComplexRemapTypes::visit
          (ConvertComplexRemapTypes *this,StructDeclaration *s)

{
  size_t sVar1;
  size_t r;
  StructDeclaration *s_local;
  ConvertComplexRemapTypes *this_local;
  
  sVar1 = (this->super_RewritingASTVisitor).itemsReplaced;
  RewritingASTVisitor::visit(&this->super_RewritingASTVisitor,s);
  if (sVar1 != (this->super_RewritingASTVisitor).itemsReplaced) {
    AST::StructDeclaration::updateStructureMembers(s);
  }
  return s;
}

Assistant:

AST::StructDeclaration& visit (AST::StructDeclaration& s) override
        {
            auto r = itemsReplaced;
            super::visit (s);

            if (r != itemsReplaced)
                s.updateStructureMembers();

            return s;
        }